

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O1

void adjust_panel_help(wchar_t y,wchar_t x,_Bool help,player *p,wchar_t mode,point_set **targets,
                      _Bool *show_interesting,int *target_index)

{
  int iVar1;
  term_conflict *t;
  ulong uVar2;
  int iVar3;
  wchar_t wVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  point_set *ppVar8;
  wchar_t wVar9;
  undefined7 in_register_00000011;
  bool bVar10;
  wchar_t wy;
  long lVar11;
  int iVar12;
  
  iVar7 = row_top_map[Term->sidebar_mode];
  iVar12 = Term->hgt + -2;
  if ((int)CONCAT71(in_register_00000011,help) == 0) {
    iVar12 = Term->hgt;
  }
  iVar1 = row_bottom_map[Term->sidebar_mode];
  lVar11 = 0;
  bVar10 = false;
  do {
    t = (term_conflict *)angband_term[lVar11];
    if ((t != (term_conflict *)0x0) && ((lVar11 == 0 || ((window_flag[lVar11] & 0x80) != 0)))) {
      if (lVar11 == 0) {
        wVar9 = ~col_map[Term->sidebar_mode] + Term->wid;
        wVar4 = iVar12 - (iVar7 + iVar1);
      }
      else {
        wVar9 = t->wid;
        wVar4 = t->hgt;
      }
      wy = t->offset_y;
      iVar6 = wVar9 / (int)(uint)tile_width;
      uVar2 = (long)wVar4 / (long)(int)(uint)tile_height;
      iVar3 = (int)uVar2;
      if (wy + iVar3 <= y) {
        do {
          wy = wy + ((int)(((uint)(uVar2 >> 0x1f) & 1) + iVar3) >> 1);
        } while (iVar3 + wy <= y);
      }
      wVar9 = t->offset_x;
      if (y < wy) {
        do {
          wy = wy - ((int)(((uint)(uVar2 >> 0x1f) & 1) + iVar3) >> 1);
        } while (y < wy);
      }
      if (wVar9 + iVar6 <= x) {
        do {
          wVar9 = wVar9 + iVar6 / 2;
        } while (iVar6 + wVar9 <= x);
      }
      if (x < wVar9) {
        do {
          wVar9 = wVar9 - iVar6 / 2;
        } while (x < wVar9);
      }
      _Var5 = modify_panel(t,wy,wVar9);
      if (_Var5) {
        bVar10 = true;
      }
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 8);
  if ((bVar10) && (handle_stuff(p), targets != (point_set **)0x0)) {
    point_set_dispose((point_set_conflict *)*targets);
    ppVar8 = target_get_monsters(mode,(monster_predicate)0x0,true);
    *targets = ppVar8;
  }
  if (target_index != (int *)0x0 && show_interesting != (_Bool *)0x0) {
    *show_interesting = false;
    iVar7 = point_set_size((point_set_conflict *)*targets);
    if (0 < iVar7) {
      lVar11 = 0;
      do {
        if (((*targets)->pts[lVar11].y == y) && ((*targets)->pts[lVar11].x == x)) {
          *target_index = (int)lVar11;
          *show_interesting = true;
          return;
        }
        lVar11 = lVar11 + 1;
        iVar7 = point_set_size((point_set_conflict *)*targets);
      } while (lVar11 < iVar7);
    }
  }
  return;
}

Assistant:

static void adjust_panel_help(int y, int x, bool help,
		struct player *p, int mode, struct point_set **targets,
		bool *show_interesting, int *target_index)
{
	bool changed = false;

	int j;

	int screen_hgt_main = help ? (Term->hgt - ROW_MAP - ROW_BOTTOM_MAP - 2)
			 : (Term->hgt - ROW_MAP - ROW_BOTTOM_MAP);

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++)
	{
		int wx, wy;
		int screen_hgt, screen_wid;

		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if ((j > 0) && !(window_flag[j] & PW_OVERHEAD)) continue;

		wy = t->offset_y;
		wx = t->offset_x;

		screen_hgt = (j == 0) ? screen_hgt_main : t->hgt;
		screen_wid = (j == 0) ? (Term->wid - COL_MAP - 1) : t->wid;

		/* Bigtile panels need adjustment */
		screen_wid = screen_wid / tile_width;
		screen_hgt = screen_hgt / tile_height;

		/* Adjust as needed */
		while (y >= wy + screen_hgt) wy += screen_hgt / 2;
		while (y < wy) wy -= screen_hgt / 2;

		/* Adjust as needed */
		while (x >= wx + screen_wid) wx += screen_wid / 2;
		while (x < wx) wx -= screen_wid / 2;

		/* Use "modify_panel" */
		if (modify_panel(t, wy, wx)) changed = true;
	}

	if (changed) {
		handle_stuff(p);
		if (targets) {
			/* Recalculate interesting grids */
			point_set_dispose(*targets);
			*targets = target_get_monsters(mode, NULL, true);
		}
	}

	if (show_interesting && target_index) {
		/* Turn interesting mode off if they clicked a boring spot... */
		*show_interesting = false;

		/* ...but turn it on if they clicked an interesting spot */
		for (j = 0; j < point_set_size(*targets); j++) {
			if (y == (*targets)->pts[j].y
					&& x == (*targets)->pts[j].x) {
				*target_index = j;
				*show_interesting = true;
				break;
			}
		}
	}
}